

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O1

void glslang::OutputConstantUnion
               (TInfoSink *out,TIntermTyped *node,TConstUnionArray *constUnion,EExtraOutput extra,
               int depth)

{
  TInfoSinkBase *this;
  TBasicType TVar1;
  TConstUnionVector *pTVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pTVar5;
  ulong uVar6;
  longlong lVar7;
  ulong uVar8;
  double dVar9;
  char *pcVar10;
  long lVar11;
  char buf [300];
  char local_188 [344];
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  uVar4 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar3));
  if (0 < (int)uVar4) {
    this = &out->debug;
    uVar8 = 0;
    do {
      OutputTreeText(out,&node->super_TIntermNode,depth);
      pTVar2 = constUnion->unionArray;
      pTVar5 = (pTVar2->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TVar1 = pTVar5[uVar8].type;
      if (0x1a < TVar1 - EbtFloat) {
switchD_003672ab_caseD_d:
        iVar3 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
        TInfoSinkBase::message
                  (&out->info,EPrefixInternalError,"Unknown constant",
                   (TSourceLoc *)CONCAT44(extraout_var_00,iVar3),false,false);
        goto LAB_003675c7;
      }
      pTVar5 = pTVar5 + uVar8;
      switch(TVar1) {
      case EbtFloat:
      case EbtDouble:
      case EbtFloat16:
        dVar9 = (pTVar5->field_0).dConst;
        if (ABS(dVar9) == INFINITY) {
          if (0.0 <= dVar9) {
            pcVar10 = "+1.#INF";
          }
          else {
            pcVar10 = "-1.#INF";
          }
          goto LAB_003675b3;
        }
        if (NAN(dVar9)) {
          pcVar10 = "1.#IND";
          goto LAB_003675b3;
        }
        pcVar10 = "%f";
        if (1000000000000.0 < ABS(dVar9)) {
          pcVar10 = "%-.13e";
        }
        if (ABS(dVar9) < 1e-05) {
          pcVar10 = "%-.13e";
        }
        if (dVar9 == (double)(tSamplePos)0x0) {
          pcVar10 = "%f";
        }
        iVar3 = snprintf(local_188,0x154,pcVar10);
        if (0x153 < iVar3) {
          __assert_fail("len < maxSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/intermOut.cpp"
                        ,0x453,
                        "void glslang::OutputDouble(TInfoSink &, double, TOutputTraverser::EExtraOutput)"
                       );
        }
        if ((((5 < iVar3) && (local_188[iVar3 - 5] == 'e')) &&
            ((local_188[iVar3 - 4] == '-' || (local_188[iVar3 - 4] == '+')))) &&
           (local_188[iVar3 - 3U] == '0')) {
          local_188[iVar3 - 3U] = local_188[iVar3 - 2U];
          local_188[iVar3 - 2U] = local_188[iVar3 - 1U];
          local_188[iVar3 - 1U] = '\0';
        }
        TInfoSinkBase::append(this,local_188);
        if (extra == BinaryDoubleOutput) {
          TInfoSinkBase::append(this," : ");
          lVar11 = 0x40;
          do {
            pcVar10 = "1";
            if (-1 < (long)dVar9) {
              pcVar10 = "0";
            }
            TInfoSinkBase::append(this,pcVar10);
            dVar9 = (double)((long)dVar9 * 2 + 1);
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        goto LAB_003675b8;
      case EbtInt8:
        uVar6 = (ulong)(uint)(int)(pTVar2->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.i8Const;
        pcVar10 = "%d (%s)";
        break;
      case EbtUint8:
        uVar6 = (ulong)(pTVar2->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.u8Const;
        pcVar10 = "%u (%s)";
        break;
      case EbtInt16:
        uVar6 = (ulong)(uint)(int)(pTVar2->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.i16Const;
        pcVar10 = "%d (%s)";
        break;
      case EbtUint16:
        uVar6 = (ulong)(pTVar2->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.u16Const;
        pcVar10 = "%u (%s)";
        break;
      case EbtInt:
        uVar6 = (ulong)(pTVar2->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.uConst;
        pcVar10 = "%d (%s)";
        break;
      case EbtUint:
        uVar6 = (ulong)(pTVar2->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.uConst;
        pcVar10 = "%u (%s)";
        break;
      case EbtInt64:
        lVar7 = (pTVar2->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.i64Const;
        pcVar10 = "%lld (%s)";
        goto LAB_0036757b;
      case EbtUint64:
        lVar7 = (pTVar2->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.i64Const;
        pcVar10 = "%llu (%s)";
LAB_0036757b:
        snprintf(local_188,300,pcVar10,lVar7);
        goto LAB_003675ad;
      case EbtBool:
        if ((pTVar5->field_0).i8Const == '\x01') {
          pcVar10 = "true";
        }
        else {
          pcVar10 = "false";
        }
        TInfoSinkBase::append(this,pcVar10);
        TInfoSinkBase::append(this," (");
        TInfoSinkBase::append(this,"const bool");
        pcVar10 = ")";
        goto LAB_003675b3;
      default:
        goto switchD_003672ab_caseD_d;
      case EbtString:
        TInfoSinkBase::append(this,"\"");
        TInfoSinkBase::append
                  (this,(((constUnion->unionArray->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].field_0.sConst)->
                        _M_dataplus)._M_p);
        pcVar10 = "\"\n";
        goto LAB_003675c2;
      }
      snprintf(local_188,300,pcVar10,uVar6);
LAB_003675ad:
      pcVar10 = local_188;
LAB_003675b3:
      TInfoSinkBase::append(this,pcVar10);
LAB_003675b8:
      pcVar10 = "\n";
LAB_003675c2:
      TInfoSinkBase::append(this,pcVar10);
LAB_003675c7:
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar4);
  }
  return;
}

Assistant:

static void OutputConstantUnion(TInfoSink& out, const TIntermTyped* node, const TConstUnionArray& constUnion,
    TOutputTraverser::EExtraOutput extra, int depth)
{
    int size = node->getType().computeNumComponents();

    for (int i = 0; i < size; i++) {
        OutputTreeText(out, node, depth);
        switch (constUnion[i].getType()) {
        case EbtBool:
            if (constUnion[i].getBConst())
                out.debug << "true";
            else
                out.debug << "false";

            out.debug << " (" << "const bool" << ")";

            out.debug << "\n";
            break;
        case EbtFloat:
        case EbtDouble:
        case EbtFloat16:
            OutputDouble(out, constUnion[i].getDConst(), extra);
            out.debug << "\n";
            break;
        case EbtInt8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI8Const(), "const int8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint8:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU8Const(), "const uint8_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getI16Const(), "const int16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint16:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getU16Const(), "const uint16_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%d (%s)", constUnion[i].getIConst(), "const int");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%u (%s)", constUnion[i].getUConst(), "const uint");

                out.debug << buf << "\n";
            }
            break;
        case EbtInt64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%lld (%s)", constUnion[i].getI64Const(), "const int64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtUint64:
            {
                const int maxSize = 300;
                char buf[maxSize];
                snprintf(buf, maxSize, "%llu (%s)", constUnion[i].getU64Const(), "const uint64_t");

                out.debug << buf << "\n";
            }
            break;
        case EbtString:
            out.debug << "\"" << constUnion[i].getSConst()->c_str() << "\"\n";
            break;
        default:
            out.info.message(EPrefixInternalError, "Unknown constant", node->getLoc());
            break;
        }
    }
}